

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,int scanline1,int scanline2)

{
  int iVar1;
  int iVar2;
  Data *pDVar3;
  uint *puVar4;
  InputStreamMutex *pIVar5;
  Compressor *pCVar6;
  IStream *pIVar7;
  bool bVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  ulong uVar12;
  uint *puVar13;
  ostream *poVar14;
  ArgExc *pAVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  char *pcVar19;
  char *pcVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  Int64 sampleCountTableDataSize;
  char *readPtr;
  Int64 unpackedDataSize;
  Int64 packedDataSize;
  char b [4];
  stringstream _iex_replace_s;
  ulong local_3a0;
  undefined8 local_398;
  ulong local_390;
  char *local_388;
  int local_380;
  int local_37c;
  char *local_378;
  pthread_mutex_t *local_370;
  ulong local_368;
  long local_360;
  long local_358;
  char *local_350;
  unsigned_long local_348;
  uint local_340 [4];
  ostream local_330 [768];
  
  if (this->_data->frameBufferValid == false) {
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar15,"readPixelSampleCounts called with no valid frame buffer");
    __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  local_370 = (pthread_mutex_t *)this->_data->_streamData;
  iVar10 = pthread_mutex_lock(local_370);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  iVar10 = (*this->_data->_streamData->is->_vptr_IStream[5])();
  local_398 = CONCAT44(extraout_var,iVar10);
  iVar10 = scanline1;
  if (scanline2 < scanline1) {
    iVar10 = scanline2;
  }
  if (this->_data->minY <= iVar10) {
    iVar21 = scanline2;
    if (scanline2 < scanline1) {
      iVar21 = scanline1;
    }
    if (iVar21 <= this->_data->maxY) {
      iVar21 = scanline1;
      if (scanline2 < scanline1) {
        iVar21 = scanline2;
      }
      lVar22 = (long)iVar21;
      iVar10 = ((scanline1 + scanline2) - iVar10) + 1;
      local_378 = "Unexpected part number.";
      local_380 = iVar10;
      do {
        pDVar3 = this->_data;
        iVar24 = pDVar3->minY;
        uVar12 = (long)(int)lVar22 - (long)iVar24;
        if ((pDVar3->gotSampleCount)._data[uVar12] == true) {
          iVar1 = pDVar3->minX;
          if (iVar1 <= pDVar3->maxX) {
            iVar2 = pDVar3->sampleCountXStride;
            lVar16 = (long)iVar1 + -1;
            puVar13 = (uint *)(pDVar3->sampleCountSliceBase +
                              (long)iVar1 * (long)iVar2 + pDVar3->sampleCountYStride * lVar22);
            lVar23 = (pDVar3->sampleCount)._sizeY;
            puVar4 = (pDVar3->sampleCount)._data;
            do {
              *puVar13 = puVar4[((long)iVar21 - (long)iVar24) * lVar23 +
                                ((lVar16 + 1) - (long)pDVar3->minX)];
              lVar16 = lVar16 + 1;
              puVar13 = (uint *)((long)puVar13 + (long)iVar2);
            } while (lVar16 < pDVar3->maxX);
          }
        }
        else {
          uVar12 = (ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff;
          uVar9 = (long)uVar12 / (long)pDVar3->linesInBuffer;
          uVar25 = uVar9 & 0xffffffff;
          pIVar5 = pDVar3->_streamData;
          iVar10 = (int)uVar9;
          local_37c = iVar21;
          local_360 = lVar22;
          (*pIVar5->is->_vptr_IStream[6])
                    (pIVar5->is,
                     (pDVar3->lineOffsets).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar10],
                     (long)uVar12 % (long)pDVar3->linesInBuffer & 0xffffffff);
          if (((pDVar3->version & 0x1000) != 0) &&
             ((*pIVar5->is->_vptr_IStream[3])(pIVar5->is,local_340,4),
             local_340[0] != pDVar3->partNumber)) {
LAB_00432b6d:
            pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar15,local_378);
            __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,local_340,4);
          uVar11 = local_340[0];
          if (local_340[0] != pDVar3->linesInBuffer * iVar10 + pDVar3->minY) {
            local_378 = "Unexpected data block y coordinate.";
            goto LAB_00432b6d;
          }
          iVar21 = pDVar3->linesInBuffer + local_340[0] + -1;
          if (pDVar3->maxY < iVar21) {
            iVar21 = pDVar3->maxY;
          }
          Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar5->is,&local_3a0);
          if ((ulong)(long)pDVar3->maxSampleCountTableSize < local_3a0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)local_340);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_330,"Bad sampleCountTableDataSize read from chunk ",0x2d);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,": expected ",0xb);
            poVar14 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar14,pDVar3->maxSampleCountTableSize);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," or less, got ",0xe);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
            pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)local_340);
            __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar5->is,&local_348);
          Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar5->is,&local_368);
          if ((local_3a0 & 0xffffffff80000000) != 0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)local_340);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_330,"This version of the library does not ",0x25);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_330,"support the allocation of data with size  > ",0x2c);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_330,0x7fffffff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," file table size    :",0x15)
            ;
            poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,".\n",2);
            pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)local_340);
            __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,(pDVar3->sampleCountTableBuffer)._data);
          if (local_3a0 < (ulong)(long)pDVar3->maxSampleCountTableSize) {
            pCVar6 = pDVar3->sampleCountTableComp;
            if (pCVar6 == (Compressor *)0x0) {
              iex_debugTrap();
              std::__cxx11::stringstream::stringstream((stringstream *)local_340);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_330,"Deep scanline data corrupt at chunk ",0x24);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14," (sampleCountTableDataSize error)",0x21);
              pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)local_340);
              __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
            }
            (*pCVar6->_vptr_Compressor[6])
                      (pCVar6,(pDVar3->sampleCountTableBuffer)._data,local_3a0,(ulong)uVar11,
                       &local_388);
          }
          else {
            local_388 = (pDVar3->sampleCountTableBuffer)._data;
          }
          local_390 = uVar25;
          if ((int)uVar11 <= iVar21) {
            local_350 = pDVar3->sampleCountSliceBase;
            local_358 = (long)pDVar3->sampleCountYStride;
            iVar24 = pDVar3->sampleCountXStride;
            puVar4 = (pDVar3->lineSampleCount)._data;
            lVar22 = (long)(int)uVar11;
            lVar16 = 0;
            pcVar20 = local_388;
            do {
              lVar23 = lVar22 - pDVar3->minY;
              puVar4[lVar23] = 0;
              if (pDVar3->minX <= pDVar3->maxX) {
                lVar26 = (long)pDVar3->minX;
                uVar11 = 0;
                do {
                  lVar18 = 0;
                  pcVar19 = pcVar20;
                  do {
                    pcVar20 = pcVar19 + 1;
                    *(char *)((long)local_340 + lVar18) = *pcVar19;
                    lVar18 = lVar18 + 1;
                    pcVar19 = pcVar20;
                  } while ((int)lVar18 != 4);
                  uVar17 = local_340[0] - uVar11;
                  local_388 = pcVar20;
                  if ((int)local_340[0] < (int)uVar11) {
                    iex_debugTrap();
                    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_330,"Deep scanline sampleCount data corrupt at chunk ",0x30);
                    poVar14 = (ostream *)
                              std::ostream::operator<<((ostream *)local_330,(int)local_390);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14," (negative sample count detected)",0x21);
                    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)local_340);
                    __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
                  }
                  (pDVar3->sampleCount)._data
                  [(pDVar3->sampleCount)._sizeY * lVar23 + (lVar26 - pDVar3->minX)] = uVar17;
                  puVar4[lVar23] = puVar4[lVar23] + uVar17;
                  *(uint *)(local_350 + lVar26 * iVar24 + lVar22 * local_358) = uVar17;
                  bVar8 = lVar26 < pDVar3->maxX;
                  lVar26 = lVar26 + 1;
                  uVar11 = local_340[0];
                } while (bVar8);
              }
              lVar16 = lVar16 + (ulong)puVar4[lVar23];
              uVar12 = pDVar3->combinedSampleSize * lVar16;
              if (local_368 <= uVar12 && uVar12 - local_368 != 0) {
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)local_340);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_330,"Deep scanline sampleCount data corrupt at chunk ",0x30);
                poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_330,(int)local_390);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,": pixel data only contains ",0x1b);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," bytes of data but table references at least ",0x2d);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," bytes of sample data",0x15);
                pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)local_340);
                __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              (pDVar3->gotSampleCount)._data[lVar22 - pDVar3->minY] = true;
              lVar22 = lVar22 + 1;
            } while (iVar21 + 1 != (int)lVar22);
          }
          pDVar3 = this->_data;
          iVar24 = iVar10 * pDVar3->linesInBuffer + pDVar3->minY;
          iVar21 = pDVar3->linesInBuffer + iVar24 + -1;
          if (pDVar3->maxY < iVar21) {
            iVar21 = pDVar3->maxY;
          }
          bytesPerDeepLineTable
                    (&pDVar3->header,iVar24,iVar21,pDVar3->sampleCountSliceBase,
                     pDVar3->sampleCountXStride,pDVar3->sampleCountYStride,&pDVar3->bytesPerLine);
          iVar10 = local_380;
          pDVar3 = this->_data;
          offsetInLineBufferTable
                    (&pDVar3->bytesPerLine,iVar24 - pDVar3->minY,iVar21 - pDVar3->minY,
                     pDVar3->linesInBuffer,&pDVar3->offsetInLineBuffer);
          lVar22 = local_360;
          iVar21 = local_37c;
        }
        lVar22 = lVar22 + 1;
        iVar21 = iVar21 + 1;
        if (iVar10 == (int)lVar22) {
          pIVar7 = this->_data->_streamData->is;
          (*pIVar7->_vptr_IStream[6])(pIVar7,local_398);
          pthread_mutex_unlock(local_370);
          return;
        }
      } while( true );
    }
  }
  pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc
            (pAVar15,"Tried to read scan line sample counts outside the image file\'s data window.")
  ;
  __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineInputFile::readPixelSampleCounts (int scanline1, int scanline2)
{
    Int64 savedFilePos = 0;

    if(!_data->frameBufferValid)
    {
        throw IEX_NAMESPACE::ArgExc("readPixelSampleCounts called with no valid frame buffer");
    }
    
    try
    {
        Lock lock (*_data->_streamData);

        savedFilePos = _data->_streamData->is->tellg();

        int scanLineMin = min (scanline1, scanline2);
        int scanLineMax = max (scanline1, scanline2);

        if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
            throw IEX_NAMESPACE::ArgExc ("Tried to read scan line sample counts outside "
                               "the image file's data window.");

        for (int i = scanLineMin; i <= scanLineMax; i++)
        {
            //
            // if scanline is already read, it'll be in the cache
            // otherwise, read from file, store in cache and in caller's framebuffer
            //
            if (_data->gotSampleCount[i - _data->minY])
            {
                fillSampleCountFromCache(i,_data);
                                         
            }else{

                int lineBlockId = ( i - _data->minY ) / _data->linesInBuffer;

                readSampleCountForLineBlock ( _data->_streamData, _data, lineBlockId );

                int minYInLineBuffer = lineBlockId * _data->linesInBuffer + _data->minY;
                int maxYInLineBuffer = min ( minYInLineBuffer + _data->linesInBuffer - 1, _data->maxY );

                //
                // For each line within the block, get the count of bytes.
                //

                bytesPerDeepLineTable ( _data->header,
                                        minYInLineBuffer,
                                        maxYInLineBuffer,
                                        _data->sampleCountSliceBase,
                                        _data->sampleCountXStride,
                                        _data->sampleCountYStride,
                                        _data->bytesPerLine );

                //
                // For each scanline within the block, get the offset.
                //

                offsetInLineBufferTable ( _data->bytesPerLine,
                                          minYInLineBuffer - _data->minY,
                                          maxYInLineBuffer - _data->minY,
                                          _data->linesInBuffer,
                                          _data->offsetInLineBuffer );
            }
        }

        _data->_streamData->is->seekg(savedFilePos);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading sample count data from image "
                     "file \"" << fileName() << "\". " << e.what());

        _data->_streamData->is->seekg(savedFilePos);

        throw;
    }
}